

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O3

void * __thiscall
SectionHdrWrapper::getFieldPtr(SectionHdrWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  undefined4 extraout_var_00;
  void *pvVar3;
  
  iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  pvVar3 = (void *)0x0;
  if ((pvVar2 != (void *)0x0) && (this->name != (char *)0x0)) {
    switch(fieldId) {
    case 0:
      break;
    case 1:
      pvVar2 = (void *)((long)pvVar2 + 8);
      break;
    case 2:
      pvVar2 = (void *)((long)pvVar2 + 0xc);
      break;
    case 3:
      pvVar2 = (void *)((long)pvVar2 + 0x10);
      break;
    case 4:
      pvVar2 = (void *)((long)pvVar2 + 0x14);
      break;
    case 5:
      pvVar2 = (void *)((long)pvVar2 + 0x18);
      break;
    case 6:
      pvVar2 = (void *)((long)pvVar2 + 0x1c);
      break;
    case 7:
      pvVar2 = (void *)((long)pvVar2 + 0x20);
      break;
    case 8:
      pvVar2 = (void *)((long)pvVar2 + 0x22);
      break;
    case 9:
      pvVar2 = (void *)((long)pvVar2 + 0x24);
      break;
    default:
      iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this);
      return (void *)CONCAT44(extraout_var_00,iVar1);
    }
    pvVar3 = pvVar2;
  }
  return pvVar3;
}

Assistant:

void* SectionHdrWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    IMAGE_SECTION_HEADER* sec = (IMAGE_SECTION_HEADER*) getPtr();
    if (!sec) return NULL;
    if (!this->name) return NULL;
    switch (fieldId)
    {
        case NAME: return (void*) &sec->Name;
        case VSIZE: return (void*) &sec->Misc.VirtualSize;
        case VPTR: return (void*) &sec->VirtualAddress;
        case RSIZE: return (void*) &sec->SizeOfRawData;
        case RPTR: return(void*) &sec->PointerToRawData;

        case RELOC_PTR: return (void*) &sec->PointerToRelocations;
        case RELOC_NUM: return (void*) &sec->NumberOfRelocations;
        case LINENUM_PTR: return (void*) &sec->PointerToLinenumbers;
        case LINENUM_NUM: return (void*) &sec->NumberOfLinenumbers;

        case CHARACT: return (void*) &sec->Characteristics;
    }
    return this->getPtr();
}